

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

void bindSuperClass(VM *vm,Class *subClass,Class *superClass)

{
  Method *pMVar1;
  Method method;
  uint local_24;
  uint32_t idx;
  Class *superClass_local;
  Class *subClass_local;
  VM *vm_local;
  
  subClass->superClass = superClass;
  subClass->fieldNum = superClass->fieldNum + subClass->fieldNum;
  for (local_24 = 0; local_24 < (superClass->methods).count; local_24 = local_24 + 1) {
    pMVar1 = (superClass->methods).datas + local_24;
    method._4_4_ = 0;
    method.type = pMVar1->type;
    method.field_1.primFn = (pMVar1->field_1).primFn;
    bindMethod(vm,subClass,local_24,method);
  }
  return;
}

Assistant:

void bindSuperClass(VM *vm, Class *subClass, Class *superClass) {
    subClass->superClass = superClass;
    subClass->fieldNum += superClass->fieldNum;
    uint32_t idx = 0;
    while (idx < superClass->methods.count) {
        bindMethod(vm, subClass, idx, superClass->methods.datas[idx]);
        idx++;
    }
}